

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O3

void rr::pa::TriangleStrip::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
               (__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  VertexPacket *pVVar1;
  VertexPacket *pVVar2;
  VertexPacket *pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (2 < numVertices) {
    pVVar3 = *vertices;
    uVar4 = 3;
    do {
      pVVar1 = vertices[uVar4 - 2];
      pVVar2 = vertices[uVar4 - 1];
      (outputIterator._M_current)->v0 = pVVar3;
      (outputIterator._M_current)->v1 = pVVar1;
      (outputIterator._M_current)->v2 = pVVar2;
      (outputIterator._M_current)->provokingIndex =
           (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 2;
      if (numVertices <= uVar4) {
        return;
      }
      pVVar3 = vertices[uVar4 - 1];
      pVVar2 = vertices[uVar4];
      outputIterator._M_current[1].v0 = pVVar3;
      outputIterator._M_current[1].v1 = pVVar1;
      outputIterator._M_current[1].v2 = pVVar2;
      outputIterator._M_current[1].provokingIndex =
           (provokingConvention != PROVOKINGVERTEX_FIRST) + 1;
      uVar5 = uVar4 + 1;
      outputIterator._M_current = outputIterator._M_current + 2;
      uVar4 = uVar4 + 2;
    } while (uVar5 < numVertices);
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 3)
		{
		}
		else
		{
			VertexPacket* vert0 = vertices[0];
			VertexPacket* vert1 = vertices[1];
			size_t ndx = 2;

			for (;;)
			{
				{
					if (ndx >= numVertices)
						break;

					*(outputIterator++) = Triangle(vert0, vert1, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (2));
					vert0 = vertices[ndx];

					ndx++;
				}

				{
					if (ndx >= numVertices)
						break;

					*(outputIterator++) = Triangle(vert0, vert1, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (1) : (2));
					vert1 = vertices[ndx];

					ndx++;
				}
			}
		}
	}